

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O2

void __thiscall mod_verify::ModVerifyTest1<int>::ModVerifyTest1(ModVerifyTest1<int> *this)

{
  ostream *poVar1;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  int r;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_54;
  string local_50;
  string local_30;
  
  local_54.m_int = -0x80000000;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            (&local_54,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x0);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<int>();
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&local_50);
  to_hex<int>(&local_50,local_54.m_int);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<int>(&local_30,0);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_50._M_dataplus._M_p._0_4_ = local_54.m_int;
  operator%=((int *)&local_50,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x0);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<int>();
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&local_50);
  to_hex<int>(&local_50,local_54.m_int);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<int>(&local_30,0);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

ModVerifyTest1<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;
		const bool expected = true;

		bool divzero;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m(0);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}
	}